

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurve,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcDimensionCurve *in;
  
  in = (IfcDimensionCurve *)operator_new(0xb8);
  *(undefined ***)&(in->super_IfcAnnotationCurveOccurrence).field_0xa0 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0xa8 = 0;
  *(char **)&in->field_0xb0 = "IfcDimensionCurve";
  Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence::IfcAnnotationCurveOccurrence
            ((IfcAnnotationCurveOccurrence *)in,&PTR_construction_vtable_24__00874010);
  *(undefined ***)
   &(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem =
       &PTR__IfcDimensionCurve_00873f30;
  *(undefined ***)&(in->super_IfcAnnotationCurveOccurrence).field_0xa0 =
       &PTR__IfcDimensionCurve_00873ff8;
  (in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDimensionCurve_00873f58;
  *(undefined ***)
   &(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x70 = &PTR__IfcDimensionCurve_00873f80;
  *(undefined ***)
   &(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x80 = &PTR__IfcDimensionCurve_00873fa8;
  *(undefined ***)&(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.field_0x90
       = &PTR__IfcDimensionCurve_00873fd0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcDimensionCurve>(db,params,in);
  return (Object *)
         (&(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.
           super_IfcStyledItem.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.
                             super_IfcStyledItem + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }